

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

void __thiscall
capnp::anon_unknown_34::BrokenClient::BrokenClient
          (BrokenClient *this,StringPtr description,bool resolved,void *brand)

{
  char *pcVar1;
  size_t sVar2;
  String result;
  String local_48;
  
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR___cxa_pure_virtual_00386e60;
  (this->super_ClientHook).brand = brand;
  capnp::_::setGlobalBrokenCapFactoryForLayoutCpp
            ((BrokenCapFactory *)&(anonymous_namespace)::brokenCapFactory);
  (this->super_Refcounted).refcount = 0;
  (this->super_ClientHook)._vptr_ClientHook = (_func_int **)&PTR_newCall_003870a8;
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&DAT_003870f8;
  sVar2 = description.content.size_ - 1;
  kj::heapString(&local_48,sVar2);
  if (sVar2 != 0) {
    pcVar1 = (char *)local_48.content.size_;
    if ((char *)local_48.content.size_ != (char *)0x0) {
      pcVar1 = local_48.content.ptr;
    }
    memcpy(pcVar1,description.content.ptr,sVar2);
  }
  kj::Exception::Exception(&this->exception,FAILED,"",0,&local_48);
  sVar2 = local_48.content.size_;
  pcVar1 = local_48.content.ptr;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    (*(code *)**(undefined8 **)local_48.content.disposer)
              (local_48.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  this->resolved = resolved;
  return;
}

Assistant:

BrokenClient(const kj::StringPtr description, bool resolved, const void* brand)
      : ClientHook(brand), exception(kj::Exception::Type::FAILED, "", 0, kj::str(description)),
        resolved(resolved) {}